

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

double * jacobi_poly(int n,double alpha,double beta,double x)

{
  long lVar1;
  double *pdVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (alpha <= -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_POLY - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Illegal input value of ALPHA = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,alpha);
    std::operator<<(poVar3,"\n");
    pcVar6 = "  But ALPHA must be greater than -1.\n";
  }
  else {
    if (-1.0 < beta) {
      if (n < 0) {
        pdVar2 = (double *)0x0;
      }
      else {
        pdVar2 = (double *)operator_new__((ulong)(uint)n * 8 + 8);
        *pdVar2 = 1.0;
        if (n != 0) {
          pdVar2[1] = ((alpha + beta) * 0.5 + 1.0) * x + (alpha - beta) * 0.5;
          if (1 < n) {
            dVar8 = pdVar2[1];
            iVar5 = 1;
            lVar4 = 0;
            do {
              dVar7 = (double)iVar5;
              iVar5 = iVar5 + 1;
              dVar9 = (double)((int)lVar4 + 4);
              lVar1 = lVar4 + 2;
              dVar11 = (double)(int)lVar1 + alpha + beta;
              dVar12 = (double)((int)lVar4 + 3) + alpha + beta;
              dVar10 = dVar9 + alpha + beta;
              dVar8 = ((dVar7 + beta) * (dVar7 + alpha) * -2.0 * dVar10 *
                       *(double *)((long)pdVar2 + lVar4 * 4) +
                      (dVar10 * dVar12 * dVar11 * x + dVar12 * (alpha + beta) * (alpha - beta)) *
                      dVar8) / (((double)iVar5 + alpha + beta) * dVar9 * dVar11);
              *(double *)((long)pdVar2 + lVar4 * 4 + 0x10) = dVar8;
              lVar4 = lVar1;
            } while ((ulong)(uint)n * 2 + -2 != lVar1);
          }
        }
      }
      return pdVar2;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_POLY - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Illegal input value of BETA = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,beta);
    std::operator<<(poVar3,"\n");
    pcVar6 = "  But BETA must be greater than -1.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar6);
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
double *jacobi_poly ( int n, double alpha, double beta, double x )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_POLY evaluates the Jacobi polynomials at X.
//
//  Differential equation:
//
//    (1-X*X) Y'' + (BETA-ALPHA-(ALPHA+BETA+2) X) Y' + N (N+ALPHA+BETA+1) Y = 0
//
//  Recursion:
//
//    P(0,ALPHA,BETA,X) = 1,
//
//    P(1,ALPHA,BETA,X) = ( (2+ALPHA+BETA)*X + (ALPHA-BETA) ) / 2
//
//    P(N,ALPHA,BETA,X)  =
//      (
//        (2*N+ALPHA+BETA-1)
//        * ((ALPHA^2-BETA^2)+(2*N+ALPHA+BETA)*(2*N+ALPHA+BETA-2)*X)
//        * P(N-1,ALPHA,BETA,X)
//        -2*(N-1+ALPHA)*(N-1+BETA)*(2*N+ALPHA+BETA) * P(N-2,ALPHA,BETA,X)
//      ) / 2*N*(N+ALPHA+BETA)*(2*N-2+ALPHA+BETA)
//
//  Restrictions:
//
//    -1 < ALPHA
//    -1 < BETA
//
//  Norm:
//
//    Integral ( -1 <= X <= 1 ) ( 1 - X )^ALPHA * ( 1 + X )^BETA
//      * P(N,ALPHA,BETA,X)^2 dX
//    = 2^(ALPHA+BETA+1) * Gamma ( N + ALPHA + 1 ) * Gamma ( N + BETA + 1 ) /
//      ( 2 * N + ALPHA + BETA ) * N! * Gamma ( N + ALPHA + BETA + 1 )
//
//  Special values:
//
//    P(N,ALPHA,BETA,1) = (N+ALPHA)!/(N!*ALPHA!) for integer ALPHA.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 April 2012
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.  Note
//    that polynomials 0 through N will be computed.
//
//    Input, double ALPHA, one of the parameters defining the Jacobi
//    polynomials, ALPHA must be greater than -1.
//
//    Input, double BETA, the second parameter defining the Jacobi
//    polynomials, BETA must be greater than -1.
//
//    Input, double X, the point at which the polynomials are to be evaluated.
//
//    Output, double JACOBI_POLY[N+1], the values of the first N+1 Jacobi
//    polynomials at the point X.
//
{
  double c1;
  double c2;
  double c3;
  double c4;
  double *cx;
  int i;

  if ( alpha <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_POLY - Fatal error!\n";
    std::cerr << "  Illegal input value of ALPHA = " << alpha << "\n";
    std::cerr << "  But ALPHA must be greater than -1.\n";
    exit ( 1 );
  }

  if ( beta <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_POLY - Fatal error!\n";
    std::cerr << "  Illegal input value of BETA = " << beta << "\n";
    std::cerr << "  But BETA must be greater than -1.\n";
    exit ( 1 );
  }

  if ( n < 0 )
  {
    return NULL;
  }

  cx = new double[n+1];

  cx[0] = 1.0;

  if ( n == 0 )
  {
    return cx;
  }

  cx[1] = ( 1.0 + 0.5 * ( alpha + beta ) ) * x 
    + 0.5 * ( alpha - beta );

  for ( i = 2; i <= n; i++ )
  {
    c1 = 2.0 * double( i ) * ( double( i ) + alpha + beta ) 
      * ( double( 2 * i - 2 ) + alpha + beta );

    c2 = ( double( 2 * i - 1 ) + alpha + beta ) 
      * ( double( 2 * i ) + alpha + beta ) 
      * ( double( 2 * i - 2 ) + alpha + beta );

    c3 = ( double( 2 * i - 1 ) + alpha + beta ) 
      * ( alpha + beta ) * ( alpha - beta );

    c4 = - double( 2 ) * ( double( i - 1 ) + alpha ) 
      * ( double( i - 1 ) + beta )  
      * ( double( 2 * i ) + alpha + beta );

    cx[i] = ( ( c3 + c2 * x ) * cx[i-1] + c4 * cx[i-2] ) / c1;
  }

  return cx;
}